

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::HandleBeginArray
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  _Elt_pointer pPVar1;
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (*(this->p_).ptr_ != '[') {
    protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/json_stream_parser.cc"
               ,0x2e6);
    other = protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (\'[\') == (*p_.data()): ");
    protobuf::internal::LogFinisher::operator=(&local_21,other);
    protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  Advance(this);
  (*this->ow_->_vptr_ObjectWriter[4])(this->ow_,(this->key_).ptr_,(this->key_).length_);
  (this->key_).ptr_ = (char *)0x0;
  (this->key_).length_ = 0;
  local_60.level_ = 4;
  pPVar1 = (this->stack_).c.
           super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pPVar1 == (this->stack_).c.
                super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ::_M_push_back_aux<google::protobuf::util::converter::JsonStreamParser::ParseType>
              (&(this->stack_).c,&local_60.level_);
  }
  else {
    *pPVar1 = ARRAY_VALUE;
    (this->stack_).c.
    super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar1 + 1;
  }
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::HandleBeginArray() {
  GOOGLE_DCHECK_EQ('[', *p_.data());
  Advance();
  ow_->StartList(key_);
  key_ = StringPiece();
  stack_.push(ARRAY_VALUE);
  return util::Status();
}